

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

QListViewItem * __thiscall
QListModeViewBase::indexToListViewItem
          (QListViewItem *__return_storage_ptr__,QListModeViewBase *this,QModelIndex *index)

{
  int iVar1;
  uint uVar2;
  QListView *pQVar4;
  int *piVar5;
  QWidgetData *pQVar6;
  int iVar7;
  Representation RVar8;
  QSize QVar9;
  QSize *pQVar10;
  QListViewPrivate *pQVar11;
  Representation RVar12;
  int iVar13;
  long lVar14;
  long in_FS_OFFSET;
  QRect r;
  QStyleOptionViewItem local_100;
  long local_30;
  int iVar3;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar14 = (this->flowPositions).d.size;
  if (((lVar14 == 0) || ((this->segmentPositions).d.size == 0)) || (lVar14 + -1 <= (long)index->r))
  {
    __return_storage_ptr__->x = -1;
    __return_storage_ptr__->y = -1;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->indexHint = -1;
    __return_storage_ptr__->visited = 0xffff;
  }
  else {
    local_100.super_QStyleOption.version = index->r;
    iVar7 = qBinarySearch<int>(&this->segmentStartRows,(int *)&local_100,0,
                               (int)(this->segmentStartRows).d.size + -1);
    memset(&local_100,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_100);
    pQVar4 = (this->super_QCommonListViewBase).qq;
    (**(code **)(*(long *)&(pQVar4->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(pQVar4,&local_100);
    QVar9 = (this->super_QCommonListViewBase).contentsSize;
    local_100.super_QStyleOption.rect.x2.m_i =
         local_100.super_QStyleOption.rect.x1.m_i + QVar9.wd.m_i.m_i + -1;
    local_100.super_QStyleOption.rect.y2.m_i =
         local_100.super_QStyleOption.rect.y1.m_i + QVar9.ht.m_i.m_i + -1;
    pQVar11 = (this->super_QCommonListViewBase).dd;
    if ((pQVar11->uniformItemSizes != true) ||
       (QVar9 = pQVar11->cachedItemSize, ((ulong)QVar9 & 0x8000000080000000) != 0)) {
      QVar9 = QCommonListViewBase::itemSize(&this->super_QCommonListViewBase,&local_100,index);
      pQVar11 = (this->super_QCommonListViewBase).dd;
    }
    piVar5 = (this->segmentPositions).d.ptr;
    iVar1 = (this->flowPositions).d.ptr[index->r];
    lVar14 = (long)iVar7;
    iVar7 = piVar5[lVar14];
    RVar12 = QVar9.wd.m_i;
    RVar8.m_i = RVar12.m_i;
    iVar13 = iVar1;
    iVar3 = iVar7;
    if (pQVar11->flow != LeftToRight) {
      iVar13 = iVar7;
      iVar3 = iVar1;
      if (pQVar11->wrap == true) {
        pQVar10 = (QSize *)(piVar5 + lVar14 + 1);
        if ((this->segmentPositions).d.size <= lVar14 + 1) {
          pQVar10 = &(this->super_QCommonListViewBase).contentsSize;
        }
        RVar8.m_i = (pQVar10->wd).m_i - iVar7;
      }
      else {
        pQVar6 = ((pQVar11->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        RVar8.m_i = ((pQVar6->crect).x2.m_i - (pQVar11->space * 2 + (pQVar6->crect).x1.m_i)) + 1;
        if (RVar8.m_i <= RVar12.m_i) {
          RVar8.m_i = RVar12.m_i;
        }
      }
    }
    uVar2 = (pQVar11->itemAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
            super_QFlagsStorage<Qt::AlignmentFlag>.i;
    iVar7 = RVar8.m_i;
    if ((uVar2 & 0x1f) != 0) {
      if (RVar8.m_i < RVar12.m_i) {
        RVar12.m_i = RVar8.m_i;
      }
      if ((uVar2 & 2) != 0) {
        iVar13 = (RVar8.m_i + iVar13) - RVar12.m_i;
      }
      iVar7 = RVar12.m_i;
      if ((uVar2 & 4) != 0) {
        iVar13 = iVar13 + (RVar8.m_i - RVar12.m_i) / 2;
      }
    }
    r.x2.m_i = iVar13 + iVar7 + -1;
    r.y1.m_i = iVar3;
    r.x1.m_i = iVar13;
    r.y2.m_i = QVar9.ht.m_i.m_i + iVar3 + -1;
    QListViewItem::QListViewItem(__return_storage_ptr__,r,index->r);
    QStyleOptionViewItem::~QStyleOptionViewItem(&local_100);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QListViewItem QListModeViewBase::indexToListViewItem(const QModelIndex &index) const
{
    if (flowPositions.isEmpty()
        || segmentPositions.isEmpty()
        || index.row() >= flowPositions.size() - 1)
        return QListViewItem();

    const int segment = qBinarySearch<int>(segmentStartRows, index.row(),
                                           0, segmentStartRows.size() - 1);


    QStyleOptionViewItem options;
    initViewItemOption(&options);
    options.rect.setSize(contentsSize);
    QSize size = (uniformItemSizes() && cachedItemSize().isValid())
                 ? cachedItemSize() : itemSize(options, index);
    QSize cellSize = size;

    QPoint pos;
    if (flow() == QListView::LeftToRight) {
        pos.setX(flowPositions.at(index.row()));
        pos.setY(segmentPositions.at(segment));
    } else { // TopToBottom
        pos.setY(flowPositions.at(index.row()));
        pos.setX(segmentPositions.at(segment));
        if (isWrapping()) { // make the items as wide as the segment
            int right = (segment + 1 >= segmentPositions.size()
                     ? contentsSize.width()
                     : segmentPositions.at(segment + 1));
            cellSize.setWidth(right - pos.x());
        } else { // make the items as wide as the viewport
            cellSize.setWidth(qMax(size.width(), viewport()->width() - 2 * spacing()));
        }
    }

    if (dd->itemAlignment & Qt::AlignHorizontal_Mask) {
        size.setWidth(qMin(size.width(), cellSize.width()));
        if (dd->itemAlignment & Qt::AlignRight)
            pos.setX(pos.x() + cellSize.width() - size.width());
        if (dd->itemAlignment & Qt::AlignHCenter)
            pos.setX(pos.x() + (cellSize.width() - size.width()) / 2);
    } else {
        size.setWidth(cellSize.width());
    }

    return QListViewItem(QRect(pos, size), index.row());
}